

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing.c
# Opt level: O1

void printf_btr_mcan(can_bittiming *bt,_Bool hdr)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,hdr) != 0) {
    printf("%10s","NBTP");
    return;
  }
  printf("0x%08x",(ulong)((bt->phase_seg2 - 1 & 0x7f) +
                          ((bt->phase_seg1 + bt->prop_seg) * 0x100 + 0xff00 & 0xffff |
                          bt->sjw << 0x19 | bt->brp * 0x10000 + 0x1ff0000 & 0x1ff0000) + 0xfe000000)
        );
  return;
}

Assistant:

static void printf_btr_mcan(struct can_bittiming *bt, bool hdr)
{
	if (hdr) {
		printf("%10s", "NBTP");
	} else {
		uint32_t nbtp;


		nbtp = (((bt->brp -1) & 0x1ff) << 16) |
			(((bt->sjw -1) & 0x7f) << 25) |
			(((bt->prop_seg + bt->phase_seg1 -1) & 0xff) << 8) |
			(((bt->phase_seg2 -1) & 0x7f) << 0);

		printf("0x%08x", nbtp);
	}
}